

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowers.cpp
# Opt level: O1

void __thiscall flowers::Rose::Rose(Rose *this,string *name)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->thorn = true;
  return;
}

Assistant:

Rose::Rose(std::string name)
        : name(name), thorn(true)
    {}